

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O3

void init_pretend_input(Am_Object *win)

{
  Am_Value *this;
  Am_Input_Char local_c [4];
  
  this = (Am_Value *)Am_Object::Get((ushort)win,0x7d2);
  draw_for_win = (Am_Drawonable *)Am_Value::operator_cast_to_void_(this);
  (**(code **)(*(long *)draw_for_win + 0x1b8))(draw_for_win,&evh);
  Am_Input_Char::Am_Input_Char(local_c,0x100,false,false,false,Am_BUTTON_DOWN,Am_SINGLE_CLICK,false)
  ;
  Am_Input_Char::operator=(&ev.input_char,local_c);
  ev.draw = draw_for_win;
  return;
}

Assistant:

void
init_pretend_input(Am_Object win)
{
  // get the drawonable
  draw_for_win = reinterpret_cast<Am_Drawonable *>(
      static_cast<Am_Ptr>(win.Get(Am_DRAWONABLE)));

  // get the dispatch function
  draw_for_win->Get_Input_Dispatch_Functions(evh);

  // create an input-event by hand, hope ev.timestamp doesn't matter
  ev.input_char = Am_Input_Char(Am_LEFT_MOUSE, false, false, false,
                                Am_BUTTON_DOWN, Am_SINGLE_CLICK);
  ev.draw = draw_for_win;
}